

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void capnp::_::(anonymous_namespace)::
     expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
               (Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
                *promise,WaitScope *waitScope)

{
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  __pid_t _Var3;
  void *pvVar4;
  TransformPromiseNodeBase *this;
  DebugExpression<bool> _kjCondition;
  OwnPromiseNode local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  pPVar1 = (promise->super_PromiseBase).node.ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x28) {
    pvVar4 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)promise,
               kj::_::
               TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00650648;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)&pPVar1[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)promise,
               kj::_::
               TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3)>
               ::anon_class_1_0_00000001_for_func::operator());
    pPVar1[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00650648;
    pPVar1[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  local_50.ptr = (PromiseNode *)0x0;
  local_30.ptr = (PromiseNode *)0x0;
  local_58.ptr = &this->super_PromiseNode;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  pcStack_40 = "expectPromiseThrows";
  local_38 = 0x1700000550;
  _Var3 = kj::Promise<bool>::wait((Promise<bool> *)&local_58,waitScope);
  _kjCondition.value = (bool)(char)_Var3;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  if (kj::_::Debug::minSeverity < 3 && (char)_Var3 == '\0') {
    kj::_::Debug::log<char_const(&)[112],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x550,ERROR,
               "\"failed: expected \" \"promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; }) .wait(waitScope)\", _kjCondition"
               ,(char (*) [112])
                "failed: expected promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; }) .wait(waitScope)"
               ,&_kjCondition);
  }
  return;
}

Assistant:

void expectPromiseThrows(kj::Promise<T>&& promise, kj::WaitScope& waitScope) {
  KJ_EXPECT(promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; })
      .wait(waitScope));
}